

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

bool PIT_CheckThing(FMultiBlockThingsIterator *it,CheckResult *cres,FBoundingBox *box,
                   FCheckPosition *tm)

{
  PClass *pPVar1;
  DObject *pDVar2;
  int iVar3;
  int iVar4;
  _func_int **pp_Var5;
  undefined4 uVar6;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 aVar7;
  byte bVar8;
  bool bVar9;
  unsigned_short uVar10;
  uint uVar11;
  int iVar12;
  ActorFlags *other;
  Self *pSVar13;
  Self *other_00;
  VMFunction **ppVVar14;
  VMFrameStack *pVVar15;
  MetaClass *pMVar16;
  MetaClass *pMVar17;
  AActor *pAVar18;
  bool *pbVar19;
  AActor *pAVar20;
  bool bVar21;
  double dVar22;
  double dVar23;
  byte local_669;
  bool local_658;
  bool local_657;
  int local_654;
  int local_5dc;
  bool local_57a;
  bool local_548;
  int local_544;
  int local_524;
  byte local_4fc;
  bool local_4e9;
  bool local_4c9;
  VMValue *local_4b0;
  VMFunction *local_4a8;
  VMFunction *local_468;
  bool local_401;
  bool local_3c1;
  TFlags<ActorFlag,_unsigned_int> local_3a8;
  TFlags<ActorFlag,_unsigned_int> local_3a4;
  TFlags<ActorFlag6,_unsigned_int> local_3a0;
  TFlags<ActorFlag,_unsigned_int> local_39c;
  TFlags<ActorFlag,_unsigned_int> local_398;
  TFlags<ActorFlag,_unsigned_int> local_394;
  undefined1 local_390 [36];
  TFlags<ActorFlag2,_unsigned_int> local_36c;
  TFlags<ActorFlag2,_unsigned_int> local_368;
  TFlags<ActorFlag2,_unsigned_int> local_364;
  TFlags<ActorFlag,_unsigned_int> local_360;
  TFlags<ActorFlag2,_unsigned_int> local_35c;
  TFlags<ActorFlag7,_unsigned_int> local_358;
  TFlags<ActorFlag3,_unsigned_int> local_354;
  undefined1 local_350 [32];
  TFlags<ActorFlag3,_unsigned_int> local_330;
  undefined1 local_32c [4];
  TFlags<ActorFlag2,_unsigned_int> local_328;
  TFlags<ActorFlag2,_unsigned_int> local_324;
  TFlags<ActorFlag,_unsigned_int> local_320;
  TFlags<ActorFlag5,_unsigned_int> local_31c;
  TAngle<double> local_318;
  FName local_310;
  int local_30c;
  TFlags<ActorFlag7,_unsigned_int> local_308;
  int newdam_2;
  TFlags<ActorFlag4,_unsigned_int> local_300;
  FName local_2fc;
  undefined1 local_2f8 [36];
  TFlags<ActorFlag2,_unsigned_int> local_2d4;
  TFlags<ActorFlag2,_unsigned_int> local_2d0;
  TFlags<ActorFlag3,_unsigned_int> local_2cc;
  TAngle<double> local_2c8;
  FName local_2bc;
  int local_2b8;
  FName local_2b4;
  int newdam_1;
  undefined1 local_2ac [4];
  TFlags<ActorFlag2,_unsigned_int> local_2a8;
  TFlags<ActorFlag3,_unsigned_int> local_2a4;
  TFlags<ActorFlag2,_unsigned_int> local_2a0;
  TFlags<ActorFlag,_unsigned_int> local_29c;
  Angle local_298;
  bool *check;
  TFlags<ActorFlag5,_unsigned_int> local_288;
  TFlags<ActorFlag4,_unsigned_int> local_284;
  TFlags<ActorFlag4,_unsigned_int> local_280;
  TFlags<ActorFlag,_unsigned_int> local_27c;
  TFlags<ActorFlag,_unsigned_int> local_278;
  TFlags<ActorFlag,_unsigned_int> local_274;
  TFlags<ActorFlag,_unsigned_int> local_270;
  TFlags<ActorBounceFlag,_unsigned_short> local_26a;
  double local_268;
  double clipheight;
  TFlags<ActorFlag,_unsigned_int> local_258;
  undefined1 local_254 [4];
  undefined1 local_250 [4];
  TFlags<ActorFlag6,_unsigned_int> local_24c;
  TFlags<ActorFlag2,_unsigned_int> local_248;
  TFlags<ActorFlag3,_unsigned_int> local_244;
  TFlags<ActorFlag2,_unsigned_int> local_240;
  TFlags<ActorFlag,_unsigned_int> local_23c;
  TFlags<ActorBounceFlag,_unsigned_short> local_236;
  TFlags<ActorFlag,_unsigned_int> local_234;
  TAngle<double> local_230;
  FName local_224;
  TAngle<double> local_220;
  FName local_218;
  int local_214;
  undefined1 local_210 [4];
  int newdam;
  TFlags<ActorFlag3,_unsigned_int> local_200;
  TFlags<ActorFlag3,_unsigned_int> local_1fc;
  TFlags<ActorFlag2,_unsigned_int> local_1f8;
  TFlags<ActorFlag,_unsigned_int> local_1f4;
  TFlags<ActorFlag2,_unsigned_int> local_1f0;
  TFlags<ActorFlag6,_unsigned_int> local_1ec;
  TFlags<ActorFlag,_unsigned_int> local_1e8;
  TFlags<ActorFlag,_unsigned_int> local_1e4;
  TFlags<ActorFlag,_unsigned_int> local_1e0 [2];
  TFlags<ActorFlag,_unsigned_int> local_1d8;
  bool res;
  TFlags<ActorFlag3,_unsigned_int> local_1d0;
  TFlags<ActorFlag6,_unsigned_int> local_1cc;
  TAngle<double> local_1c8;
  FName local_1bc;
  Self local_1b8;
  undefined1 local_1b4 [4];
  undefined1 local_1b0 [4];
  TFlags<ActorFlag6,_unsigned_int> local_1ac;
  TFlags<ActorFlag6,_unsigned_int> local_1a8;
  TFlags<ActorFlag,_unsigned_int> local_1a4;
  TFlags<ActorFlag6,_unsigned_int> local_1a0;
  int local_19c;
  Angle local_198;
  VMFunction *func;
  MetaClass *clss;
  undefined1 local_180 [4];
  int retval;
  VMReturn ret;
  undefined1 local_158 [8];
  VMValue params [3];
  TFlags<ActorBounceFlag,_unsigned_short> local_11a;
  TFlags<ActorFlag6,_unsigned_int> local_118;
  TFlags<ActorFlag2,_unsigned_int> local_114;
  undefined1 local_110 [4];
  TFlags<ActorFlag,_unsigned_int> local_10c;
  undefined1 local_108 [4];
  TFlags<ActorFlag6,_unsigned_int> local_104;
  TFlags<ActorFlag,_unsigned_int> local_100;
  TFlags<ActorFlag3,_unsigned_int> local_fc;
  TFlags<ActorFlag3,_unsigned_int> local_f8;
  TFlags<ActorFlag3,_unsigned_int> local_f4;
  TFlags<ActorFlag2,_unsigned_int> local_f0;
  TFlags<ActorFlag6,_unsigned_int> local_ec;
  TFlags<ActorFlag5,_unsigned_int> local_e8;
  TFlags<ActorFlag2,_unsigned_int> local_e4;
  TFlags<ActorFlag,_unsigned_int> local_e0;
  TFlags<ActorFlag4,_unsigned_int> local_dc;
  TFlags<ActorFlag2,_unsigned_int> local_d8;
  TFlags<ActorFlag3,_unsigned_int> local_d4;
  TFlags<ActorFlag3,_unsigned_int> local_d0;
  TFlags<ActorFlag3,_unsigned_int> local_cc;
  double local_c8;
  double olddist;
  double newdist;
  DVector3 oldpos;
  TFlags<ActorFlag3,_unsigned_int> local_98;
  TFlags<ActorFlag4,_unsigned_int> local_94;
  TFlags<ActorFlag,_unsigned_int> local_90;
  undefined1 local_8c [4];
  TFlags<ActorFlag,_unsigned_int> local_88;
  TFlags<ActorFlag,_unsigned_int> local_84;
  TFlags<ActorFlag,_unsigned_int> local_80;
  bool local_79;
  undefined1 local_78 [4];
  undefined1 local_74 [3];
  bool unblocking;
  TFlags<ActorFlag6,_unsigned_int> local_70;
  TFlags<ActorFlag2,_unsigned_int> local_6c;
  TFlags<ActorFlag2,_unsigned_int> local_68;
  TFlags<ActorFlag2,_unsigned_int> local_64;
  DObject *local_60;
  double blockdist;
  TFlags<ActorFlag,_unsigned_int> local_50;
  TFlags<ActorFlag,_unsigned_int> local_4c;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 local_48;
  int damage;
  bool solid;
  double topz;
  AActor *thing;
  FCheckPosition *tm_local;
  FBoundingBox *box_local;
  CheckResult *cres_local;
  FMultiBlockThingsIterator *it_local;
  
  topz = (double)cres->thing;
  if ((AActor *)topz == tm->thing) {
    it_local._7_1_ = 1;
    bVar8 = it_local._7_1_;
    goto LAB_0057f870;
  }
  other = &((AActor *)topz)->flags;
  thing = (AActor *)tm;
  tm_local = (FCheckPosition *)box;
  box_local = (FBoundingBox *)cres;
  cres_local = (CheckResult *)it;
  operator|((int)&blockdist + MF_SHOOTABLE,MF_SOLID);
  TFlags<ActorFlag,_unsigned_int>::operator|(&local_50,(int)&blockdist + MF_SHOOTABLE);
  TFlags<ActorFlag,_unsigned_int>::operator&(&local_4c,other);
  uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_4c);
  bVar21 = true;
  if (uVar11 == 0) {
    TFlags<ActorFlag6,_unsigned_int>::operator&
              ((TFlags<ActorFlag6,_unsigned_int> *)&blockdist,
               SUB84(topz,0) + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
    uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&blockdist);
    bVar21 = uVar11 != 0;
  }
  if (!bVar21) {
    it_local._7_1_ = 1;
    bVar8 = it_local._7_1_;
    goto LAB_0057f870;
  }
  local_60 = (DObject *)
             (*(double *)((long)topz + 0x178) +
             (double)(thing->super_DThinker).super_DObject._vptr_DObject[0x2f]);
  dVar22 = AActor::X((AActor *)topz);
  if (((double)local_60 <= ABS(dVar22 - box_local->m_Box[1])) ||
     (dVar22 = AActor::Y((AActor *)topz),
     (double)local_60 <= (double)((ulong)(dVar22 - box_local->m_Box[2]) & (ulong)DAT_008a5260))) {
    it_local._7_1_ = 1;
    bVar8 = it_local._7_1_;
    goto LAB_0057f870;
  }
  pSVar13 = (Self *)((long)topz + 0x1c0);
  TFlags<ActorFlag2,_unsigned_int>::TFlags
            (&local_6c,(Self *)((thing->super_DThinker).super_DObject._vptr_DObject + 0x38));
  TFlags<ActorFlag2,_unsigned_int>::operator|(&local_68,pSVar13);
  TFlags<ActorFlag2,_unsigned_int>::operator&(&local_64,(ActorFlag2)&local_68);
  uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_64);
  if (uVar11 != 0) {
    it_local._7_1_ = 1;
    bVar8 = it_local._7_1_;
    goto LAB_0057f870;
  }
  TFlags<ActorFlag6,_unsigned_int>::operator&
            (&local_70,
             (int)(thing->super_DThinker).super_DObject._vptr_DObject +
             (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
  uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_70);
  local_3c1 = false;
  if (uVar11 != 0) {
    AActor::GetSpecies((AActor *)local_74);
    AActor::GetSpecies((AActor *)local_78);
    local_3c1 = FName::operator==((FName *)local_74,(FName *)local_78);
  }
  if (local_3c1 != false) {
    it_local._7_1_ = 1;
    bVar8 = it_local._7_1_;
    goto LAB_0057f870;
  }
  (thing->super_DThinker).super_DObject._vptr_DObject[0x6a] = (_func_int *)topz;
  _damage = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)AActor::Top((AActor *)topz);
  local_79 = false;
  if (((ulong)box_local[1].m_Box[0] & 0x80) == 0) {
    bVar21 = false;
    if ((i_compatflags & 0x10U) == 0) {
      pp_Var5 = (thing->super_DThinker).super_DObject._vptr_DObject;
      operator|((EnumType)local_8c,MF_FLOAT);
      TFlags<ActorFlag,_unsigned_int>::operator|(&local_88,(ActorFlag)local_8c);
      TFlags<ActorFlag,_unsigned_int>::operator|(&local_84,(ActorFlag)&local_88);
      TFlags<ActorFlag,_unsigned_int>::operator&(&local_80,(Self *)((long)pp_Var5 + 0x1bc));
      uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_80);
      bVar21 = false;
      if (uVar11 == 0) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_90,
                   SUB84(topz,0) +
                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE
                   ));
        uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_90);
        bVar21 = false;
        if (uVar11 != 0) {
          TFlags<ActorFlag4,_unsigned_int>::operator&
                    (&local_94,
                     SUB84(topz,0) +
                     (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
          uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_94);
          bVar21 = uVar11 != 0;
        }
      }
    }
    if (bVar21) {
      TFlags<ActorFlag3,_unsigned_int>::operator&
                (&local_98,
                 (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                 (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
      uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_98);
      aVar7 = _damage;
      bVar21 = false;
      if ((uVar11 != 0) &&
         (bVar21 = false, (double)(thing->super_DThinker).NextThinker <= (double)_damage)) {
        dVar22 = AActor::Z((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
        bVar21 = (double)aVar7 <=
                 dVar22 + (double)(thing->super_DThinker).super_DObject._vptr_DObject[0x7e];
      }
      if (bVar21) {
        (thing->OldRenderPos).Z = topz;
        (thing->super_DThinker).NextThinker = (DThinker *)_damage;
      }
    }
    if ((((ulong)(thing->OldRenderPos).X & 0x1000000) != 0) ||
       (bVar21 = false,
       (thing->super_DThinker).super_DObject._vptr_DObject[0x46] != (_func_int *)0x0)) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                ((TFlags<ActorFlag,_unsigned_int> *)((long)&oldpos.Z + 4),
                 SUB84(topz,0) +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&oldpos.Z + 4));
      bVar21 = uVar11 != 0;
    }
    if (bVar21) {
      AActor::PosRelative((DVector3 *)&newdist,
                          (AActor *)(thing->super_DThinker).super_DObject._vptr_DObject,
                          (AActor *)topz);
      pPVar1 = (thing->super_DThinker).super_DObject.Class;
      dVar22 = AActor::X((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
      if (((double)pPVar1 == dVar22) && (!NAN((double)pPVar1) && !NAN(dVar22))) {
        pDVar2 = (thing->super_DThinker).super_DObject.ObjNext;
        dVar22 = AActor::Y((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
        if (((double)pDVar2 == dVar22) && (!NAN((double)pDVar2) && !NAN(dVar22))) {
          local_79 = true;
          goto LAB_0057d106;
        }
      }
      dVar22 = AActor::X((AActor *)topz);
      if (((double)((ulong)(dVar22 - newdist) & (ulong)DAT_008a5260) <
           *(double *)((long)topz + 0x178) +
           (double)(thing->super_DThinker).super_DObject._vptr_DObject[0x2f]) &&
         (dVar22 = AActor::Y((AActor *)topz),
         (double)((ulong)(dVar22 - oldpos.X) & (ulong)DAT_008a5260) <
         *(double *)((long)topz + 0x178) +
         (double)(thing->super_DThinker).super_DObject._vptr_DObject[0x2f])) {
        olddist = AActor::Distance2D((AActor *)topz,box_local->m_Box[1],box_local->m_Box[2]);
        local_c8 = AActor::Distance2D((AActor *)topz,newdist,oldpos.X);
        if (local_c8 < olddist) {
          dVar22 = AActor::Top((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
          dVar23 = AActor::Z((AActor *)topz);
          if (dVar22 <= dVar23) {
LAB_0057d07e:
            pp_Var5 = (thing->super_DThinker).super_DObject._vptr_DObject;
            TFlags<ActorFlag3,_unsigned_int>::TFlags(&local_d4,(Self *)((long)topz + 0x1c4));
            TFlags<ActorFlag3,_unsigned_int>::operator&(&local_d0,(Self *)((long)pp_Var5 + 0x1c4));
            TFlags<ActorFlag3,_unsigned_int>::operator&(&local_cc,(ActorFlag3)&local_d0);
            uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_cc);
            local_401 = uVar11 != 0;
          }
          else {
            dVar22 = AActor::Z((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
            local_401 = true;
            if ((double)_damage <= dVar22) goto LAB_0057d07e;
          }
          local_79 = local_401;
        }
      }
    }
  }
LAB_0057d106:
  TFlags<ActorFlag2,_unsigned_int>::operator&
            (&local_d8,
             (int)(thing->super_DThinker).super_DObject._vptr_DObject +
             (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
  uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_d8);
  if (uVar11 == 0) {
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_dc,
               SUB84(topz,0) + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH)
              );
    uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_dc);
    bVar21 = false;
    if (uVar11 != 0) goto LAB_0057d16d;
  }
  else {
LAB_0057d16d:
    bVar21 = (i_compatflags & 0x10U) == 0;
  }
  if (bVar21) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_e0,
               (int)(thing->super_DThinker).super_DObject._vptr_DObject +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e0);
    bVar21 = true;
    if (uVar11 != 0) {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_e4,
                 (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                 (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
      uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e4);
      bVar21 = true;
      if (uVar11 != 0) {
        TFlags<ActorFlag5,_unsigned_int>::operator&
                  (&local_e8,
                   SUB84(topz,0) +
                   (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|MF5_NOFORWARDFALL|MF5_NODROPOFF));
        uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e8);
        bVar21 = true;
        if (uVar11 == 0) {
          TFlags<ActorFlag6,_unsigned_int>::operator&
                    (&local_ec,
                     (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                     (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
          uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_ec);
          bVar21 = false;
          if (uVar11 != 0) {
            TFlags<ActorFlag2,_unsigned_int>::operator&
                      (&local_f0,SUB84(topz,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
            uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_f0);
            bVar21 = uVar11 != 0;
          }
        }
      }
    }
    if (bVar21) {
      pp_Var5 = (thing->super_DThinker).super_DObject._vptr_DObject;
      TFlags<ActorFlag3,_unsigned_int>::TFlags(&local_fc,(Self *)((long)topz + 0x1c4));
      TFlags<ActorFlag3,_unsigned_int>::operator&(&local_f8,(Self *)((long)pp_Var5 + 0x1c4));
      TFlags<ActorFlag3,_unsigned_int>::operator&(&local_f4,(ActorFlag3)&local_f8);
      uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_f4);
      if (uVar11 == 0) {
        dVar22 = AActor::Z((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
        if (dVar22 < (double)_damage) {
          dVar22 = AActor::Top((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
          dVar23 = AActor::Z((AActor *)topz);
          if (dVar23 < dVar22) goto LAB_0057d396;
        }
        it_local._7_1_ = 1;
        bVar8 = it_local._7_1_;
        goto LAB_0057f870;
      }
    }
  }
LAB_0057d396:
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_100,
             SUB84(topz,0) +
             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
  uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_100);
  if (uVar11 == 0) {
    other_00 = (Self *)((long)topz + 0x1d0);
    operator|((EnumType)local_108,MF6_TOUCHY);
    TFlags<ActorFlag6,_unsigned_int>::operator&(&local_104,other_00);
    uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_104);
    bVar21 = false;
    if (uVar11 != 0) goto LAB_0057d423;
  }
  else {
LAB_0057d423:
    pp_Var5 = (thing->super_DThinker).super_DObject._vptr_DObject;
    operator|((EnumType)local_110,MF_SOLID);
    TFlags<ActorFlag,_unsigned_int>::operator&(&local_10c,(Self *)((long)pp_Var5 + 0x1bc));
    uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_10c);
    bVar21 = true;
    if (uVar11 == 0) {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_114,
                 (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                 (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
      uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_114);
      bVar21 = true;
      if (uVar11 == 0) {
        TFlags<ActorFlag6,_unsigned_int>::operator&
                  (&local_118,
                   (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                   (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
        uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_118);
        bVar21 = true;
        if (uVar11 == 0) {
          TFlags<ActorBounceFlag,_unsigned_short>::operator&
                    (&local_11a,
                     (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                     (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_HereticType|BOUNCE_AllActors|
                     BOUNCE_Actors));
          uVar10 = TFlags::operator_cast_to_unsigned_short((TFlags *)&local_11a);
          bVar21 = uVar10 != 0;
        }
      }
    }
  }
  if (bVar21) {
    if ((PIT_CheckThing::VIndex == 0xffffffff) &&
       (PIT_CheckThing::VIndex = GetVirtualIndex(AActor::RegistrationInfo.MyClass,"CanCollideWith"),
       PIT_CheckThing::VIndex == 0xffffffff)) {
      __assert_fail("VIndex != ~0u",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                    ,0x4f0,
                    "bool PIT_CheckThing(FMultiBlockThingsIterator &, FMultiBlockThingsIterator::CheckResult &, const FBoundingBox &, FCheckPosition &)"
                   );
    }
    VMValue::VMValue((VMValue *)local_158,
                     (DObject *)(thing->super_DThinker).super_DObject._vptr_DObject);
    VMValue::VMValue((VMValue *)((long)&params[0].field_0 + 8),(DObject *)topz);
    VMValue::VMValue((VMValue *)((long)&params[1].field_0 + 8),0);
    VMReturn::IntAt((VMReturn *)local_180,(int *)((long)&clss + 4));
    func = (VMFunction *)
           AActor::GetClass((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
    uVar11 = TArray<VMFunction_*,_VMFunction_*>::Size(&(((MetaClass *)func)->super_PClass).Virtuals)
    ;
    if (PIT_CheckThing::VIndex < uVar11) {
      ppVVar14 = TArray<VMFunction_*,_VMFunction_*>::operator[]
                           ((TArray<VMFunction_*,_VMFunction_*> *)&func[3].super_DObject.Class,
                            (ulong)PIT_CheckThing::VIndex);
      local_468 = *ppVVar14;
    }
    else {
      local_468 = (VMFunction *)0x0;
    }
    local_198.Degrees = (double)local_468;
    if (local_468 == (VMFunction *)0x0) {
LAB_0057d796:
      std::swap<void*>((void **)local_158,(void **)((long)&params[0].field_0 + 8));
      params[1].field_0.field_1.atag = 1;
      func = (VMFunction *)AActor::GetClass((AActor *)topz);
      uVar11 = TArray<VMFunction_*,_VMFunction_*>::Size
                         (&(((MetaClass *)func)->super_PClass).Virtuals);
      if (PIT_CheckThing::VIndex < uVar11) {
        ppVVar14 = TArray<VMFunction_*,_VMFunction_*>::operator[]
                             ((TArray<VMFunction_*,_VMFunction_*> *)&func[3].super_DObject.Class,
                              (ulong)PIT_CheckThing::VIndex);
        local_4a8 = *ppVVar14;
      }
      else {
        local_4a8 = (VMFunction *)0x0;
      }
      local_198.Degrees = (double)local_4a8;
      if (local_4a8 != (VMFunction *)0x0) {
        pVVar15 = (VMFrameStack *)_ZTW13GlobalVMStack();
        VMFrameStack::Call(pVVar15,(VMFunction *)local_198.Degrees,(VMValue *)local_158,3,
                           (VMReturn *)local_180,1,(VMException **)0x0);
        if (clss._4_4_ == 0) {
          it_local._7_1_ = 1;
          local_19c = 1;
          goto LAB_0057d8b4;
        }
      }
      local_19c = 0;
    }
    else {
      pVVar15 = (VMFrameStack *)_ZTW13GlobalVMStack();
      VMFrameStack::Call(pVVar15,(VMFunction *)local_198.Degrees,(VMValue *)local_158,3,
                         (VMReturn *)local_180,1,(VMException **)0x0);
      if (clss._4_4_ != 0) goto LAB_0057d796;
      it_local._7_1_ = 1;
      local_19c = 1;
    }
LAB_0057d8b4:
    local_4b0 = (VMValue *)((long)&params[2].field_0 + 8);
    do {
      local_4b0 = local_4b0 + -1;
      VMValue::~VMValue(local_4b0);
    } while (local_4b0 != (VMValue *)local_158);
    bVar8 = it_local._7_1_;
    if (local_19c != 0) goto LAB_0057f870;
  }
  if (((thing->super_DThinker).super_DObject._vptr_DObject[0x46] == (_func_int *)0x0) ||
     ((*(uint *)((thing->super_DThinker).super_DObject._vptr_DObject[0x46] + 0xe8) & 0x2000) == 0))
  {
    TFlags<ActorFlag6,_unsigned_int>::operator&
              (&local_1a0,
               SUB84(topz,0) + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
    uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1a0);
    local_4c9 = false;
    if (uVar11 != 0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_1a4,
                 (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1a4);
      local_4c9 = false;
      if ((uVar11 != 0) && (local_4c9 = false, 0 < *(int *)((long)topz + 0x1fc))) {
        TFlags<ActorFlag6,_unsigned_int>::operator&
                  (&local_1a8,
                   SUB84(topz,0) + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
        uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1a8);
        if (uVar11 == 0) {
          bVar21 = AActor::IsSentient((AActor *)topz);
          local_4c9 = false;
          if (!bVar21) goto LAB_0057dbcf;
        }
        if (*(long *)((long)topz + 0x230) == 0) {
          pMVar16 = AActor::GetClass((AActor *)topz);
          pMVar17 = AActor::GetClass((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
          local_4c9 = false;
          if (pMVar16 == pMVar17) goto LAB_0057dbcf;
        }
        TFlags<ActorFlag6,_unsigned_int>::operator&
                  (&local_1ac,
                   SUB84(topz,0) + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
        uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1ac);
        if (uVar11 != 0) {
          AActor::GetSpecies((AActor *)local_1b0);
          AActor::GetSpecies((AActor *)local_1b4);
          bVar21 = FName::operator!=((FName *)local_1b0,(FName *)local_1b4);
          local_4c9 = false;
          if (!bVar21) goto LAB_0057dbcf;
        }
        aVar7 = _damage;
        dVar22 = AActor::Z((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
        local_4c9 = false;
        if (dVar22 <= (double)aVar7) {
          dVar22 = AActor::Top((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
          dVar23 = AActor::Z((AActor *)topz);
          local_4c9 = false;
          if (dVar23 <= dVar22) {
            bVar21 = TObjPtr<AActor>::operator!=
                               ((TObjPtr<AActor> *)((long)topz + 0x280),
                                (AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
            local_4e9 = false;
            if (bVar21) {
              local_4e9 = TObjPtr<AActor>::operator!=
                                    ((TObjPtr<AActor> *)
                                     ((thing->super_DThinker).super_DObject._vptr_DObject + 0x50),
                                     (AActor *)topz);
            }
            local_4c9 = local_4e9;
          }
        }
      }
    }
LAB_0057dbcf:
    if (local_4c9 != false) {
      operator~((EnumType)&local_1b8);
      TFlags<ActorFlag6,_unsigned_int>::operator&=
                ((TFlags<ActorFlag6,_unsigned_int> *)((long)topz + 0x1d0),&local_1b8);
      dVar22 = topz;
      iVar12 = *(int *)((long)topz + 0x1fc);
      FName::FName(&local_1bc,NAME_None);
      TAngle<double>::TAngle(&local_1c8,0.0);
      P_DamageMobj((AActor *)dVar22,(AActor *)0x0,(AActor *)0x0,iVar12,&local_1bc,8,&local_1c8);
      it_local._7_1_ = 1;
      bVar8 = it_local._7_1_;
      goto LAB_0057f870;
    }
    TFlags<ActorFlag6,_unsigned_int>::operator&
              (&local_1cc,
               SUB84(topz,0) + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
    uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1cc);
    bVar21 = false;
    if (uVar11 != 0) {
      if ((thing->super_DThinker).super_DObject._vptr_DObject[0x46] == (_func_int *)0x0) {
        if ((*(uint *)((long)topz + 0x334) & 8) != 0) {
          TFlags<ActorFlag3,_unsigned_int>::operator&
                    (&local_1d0,
                     (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                     (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
          uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1d0);
          if (uVar11 != 0) goto LAB_0057dd5e;
        }
        bVar21 = false;
        if ((*(uint *)((long)topz + 0x334) & 0x10) != 0) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    ((TFlags<ActorFlag,_unsigned_int> *)&stack0xfffffffffffffe2c,
                     (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
          uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&stack0xfffffffffffffe2c);
          bVar21 = false;
          if (uVar11 != 0) goto LAB_0057dd5e;
        }
      }
      else {
LAB_0057dd5e:
        bVar21 = *(int *)((long)topz + 0x338) < level.maptime;
      }
    }
    if ((bVar21) &&
       (bVar21 = P_ActivateThingSpecial
                           ((AActor *)topz,
                            (AActor *)(thing->super_DThinker).super_DObject._vptr_DObject,false),
       bVar21)) {
      *(int *)((long)topz + 0x338) = level.maptime + 0x23;
    }
  }
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_1d8,
             (int)(thing->super_DThinker).super_DObject._vptr_DObject +
             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
  uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1d8);
  if (uVar11 == 0) {
    if (((thing->super_DThinker).super_DObject._vptr_DObject[0x46] == (_func_int *)0x0) ||
       ((*(uint *)((thing->super_DThinker).super_DObject._vptr_DObject[0x46] + 0xe8) & 0x2000) == 0)
       ) {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_1f0,
                 (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                 (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
      uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1f0);
      bVar21 = false;
      if (uVar11 != 0) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_1f4,
                   SUB84(topz,0) +
                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE
                   ));
        uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1f4);
        bVar21 = uVar11 != 0;
      }
      if (bVar21) {
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  (&local_1f8,SUB84(topz,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
        uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1f8);
        bVar21 = false;
        if (uVar11 == 0) {
          TFlags<ActorFlag3,_unsigned_int>::operator&
                    (&local_1fc,
                     SUB84(topz,0) +
                     (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
          uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1fc);
          bVar21 = false;
          if (uVar11 != 0) {
            TFlags<ActorFlag3,_unsigned_int>::operator&
                      (&local_200,
                       SUB84(topz,0) +
                       (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
            uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_200);
            bVar21 = uVar11 == 0;
          }
        }
        if (bVar21) {
          TVector3<double>::XY((TVector3<double> *)local_210);
          TVector3<double>::operator+=((TVector3<double> *)((long)topz + 200),(Vector2 *)local_210);
          dVar22 = topz;
          if (3.0 < ABS(*(double *)((long)topz + 200)) + ABS(*(double *)((long)topz + 0xd0))) {
            iVar12 = *(int *)((thing->super_DThinker).super_DObject._vptr_DObject + 0x7f) / 100 + 1;
            pAVar18 = (AActor *)(thing->super_DThinker).super_DObject._vptr_DObject;
            pAVar20 = (AActor *)(thing->super_DThinker).super_DObject._vptr_DObject;
            local_48._0_4_ = iVar12;
            FName::FName(&local_218,
                         (FName *)((long)(thing->super_DThinker).super_DObject._vptr_DObject + 0x404
                                  ));
            TAngle<double>::TAngle(&local_220,0.0);
            local_214 = P_DamageMobj((AActor *)dVar22,pAVar18,pAVar20,iVar12,&local_218,0,&local_220
                                    );
            local_524 = local_214;
            if (local_214 < 1) {
              local_524 = local_48._0_4_;
            }
            P_TraceBleed(local_524,(AActor *)topz,
                         (AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
            dVar22 = topz;
            local_48._0_4_ = *(int *)((long)topz + 0x3f8) / 100 + 1;
            pAVar18 = (AActor *)(thing->super_DThinker).super_DObject._vptr_DObject;
            iVar12 = (int)local_48._0_4_ >> 2;
            FName::FName(&local_224,
                         (FName *)((long)(thing->super_DThinker).super_DObject._vptr_DObject + 0x404
                                  ));
            TAngle<double>::TAngle(&local_230,0.0);
            local_214 = P_DamageMobj(pAVar18,(AActor *)dVar22,(AActor *)dVar22,iVar12,&local_224,0,
                                     &local_230);
            local_544 = local_214;
            if (local_214 < 1) {
              local_544 = local_48._0_4_;
            }
            P_TraceBleed(local_544,(AActor *)(thing->super_DThinker).super_DObject._vptr_DObject,
                         (AActor *)topz);
          }
          it_local._7_1_ = 0;
          bVar8 = it_local._7_1_;
          goto LAB_0057f870;
        }
      }
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_234,
                 (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_234);
      bVar21 = true;
      if (uVar11 == 0) {
        TFlags<ActorBounceFlag,_unsigned_short>::operator&
                  (&local_236,
                   (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                   (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_HereticType|BOUNCE_AllActors|
                   BOUNCE_Actors));
        uVar10 = TFlags::operator_cast_to_unsigned_short((TFlags *)&local_236);
        bVar21 = false;
        if (uVar10 != 0) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_23c,
                     (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
          uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_23c);
          bVar21 = uVar11 == 0;
        }
      }
      if (bVar21) {
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  (&local_240,SUB84(topz,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
        uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_240);
        if (uVar11 == 0) {
          TFlags<ActorFlag3,_unsigned_int>::operator&
                    (&local_244,
                     SUB84(topz,0) +
                     (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
          uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_244);
          bVar21 = false;
          if (uVar11 != 0) {
            TFlags<ActorFlag2,_unsigned_int>::operator&
                      (&local_248,
                       (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                       (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
            uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_248);
            bVar21 = uVar11 != 0;
          }
          if (bVar21) {
            it_local._7_1_ = 1;
            bVar8 = it_local._7_1_;
          }
          else {
            TFlags<ActorFlag6,_unsigned_int>::operator&
                      (&local_24c,
                       (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                       (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
            uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_24c);
            local_548 = false;
            if (uVar11 != 0) {
              pAVar18 = TObjPtr::operator_cast_to_AActor_
                                  ((TObjPtr *)
                                   ((thing->super_DThinker).super_DObject._vptr_DObject + 0x41));
              local_548 = false;
              if (pAVar18 != (AActor *)0x0) {
                TObjPtr<AActor>::operator->
                          ((TObjPtr<AActor> *)
                           ((thing->super_DThinker).super_DObject._vptr_DObject + 0x41));
                AActor::GetSpecies((AActor *)local_250);
                AActor::GetSpecies((AActor *)local_254);
                local_548 = FName::operator==((FName *)local_250,(FName *)local_254);
              }
            }
            if (local_548 == false) {
              TFlags<ActorFlag,_unsigned_int>::operator&
                        (&local_258,
                         SUB84(topz,0) +
                         (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                         MF_SHOOTABLE));
              uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_258);
              bVar21 = false;
              if (uVar11 != 0) {
                TFlags<ActorFlag2,_unsigned_int>::operator&
                          ((TFlags<ActorFlag2,_unsigned_int> *)((long)&clipheight + 4),
                           (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                           (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
                uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&clipheight + 4));
                bVar21 = false;
                if (uVar11 != 0) {
                  TFlags<ActorFlag,_unsigned_int>::operator&
                            ((TFlags<ActorFlag,_unsigned_int> *)&clipheight,
                             SUB84(topz,0) +
                             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                             MF_SHOOTABLE));
                  uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&clipheight);
                  bVar21 = uVar11 == 0;
                }
              }
              if (bVar21) {
                it_local._7_1_ = 1;
                bVar8 = it_local._7_1_;
              }
              else {
                if (*(double *)((long)topz + 400) <= 0.0) {
                  if ((0.0 < *(double *)((long)topz + 400) || *(double *)((long)topz + 400) == 0.0)
                     || ((i_compatflags & 0x80000U) == 0)) {
                    local_268 = *(double *)((long)topz + 0x180);
                  }
                  else {
                    local_268 = -*(double *)((long)topz + 400);
                  }
                }
                else {
                  local_268 = *(double *)((long)topz + 400);
                }
                dVar22 = AActor::Z((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
                dVar23 = AActor::Z((AActor *)topz);
                if (dVar22 <= dVar23 + local_268) {
                  dVar22 = AActor::Top((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject
                                      );
                  dVar23 = AActor::Z((AActor *)topz);
                  if (dVar23 <= dVar22) {
                    TFlags<ActorBounceFlag,_unsigned_short>::operator&
                              (&local_26a,
                               (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                               (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_HereticType|BOUNCE_AllActors|
                               BOUNCE_Actors));
                    uVar10 = TFlags::operator_cast_to_unsigned_short((TFlags *)&local_26a);
                    bVar21 = false;
                    if (uVar10 != 0) {
                      bVar9 = AActor::IsZeroDamage
                                        ((AActor *)
                                         (thing->super_DThinker).super_DObject._vptr_DObject);
                      bVar21 = true;
                      if (!bVar9) {
                        TFlags<ActorFlag,_unsigned_int>::operator&
                                  (&local_270,
                                   (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|
                                    MF_NOSECTOR|MF_SHOOTABLE));
                        uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_270);
                        bVar21 = uVar11 == 0;
                      }
                    }
                    if (bVar21) {
                      bVar21 = TObjPtr<AActor>::operator==
                                         ((TObjPtr<AActor> *)
                                          ((thing->super_DThinker).super_DObject._vptr_DObject +
                                          0x41),(AActor *)topz);
                      bVar8 = 1;
                      if (!bVar21) {
                        TFlags<ActorFlag,_unsigned_int>::operator&
                                  (&local_274,
                                   SUB84(topz,0) +
                                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|
                                    MF_NOSECTOR|MF_SHOOTABLE));
                        uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_274);
                        bVar8 = uVar11 == 0;
                      }
                    }
                    else {
                      iVar12 = AActor::SpecialMissileHit
                                         ((AActor *)
                                          (thing->super_DThinker).super_DObject._vptr_DObject,
                                          (AActor *)topz);
                      if (iVar12 == 0) {
                        it_local._7_1_ = 0;
                        bVar8 = it_local._7_1_;
                      }
                      else if (iVar12 == 1) {
                        it_local._7_1_ = 1;
                        bVar8 = it_local._7_1_;
                      }
                      else {
                        bVar21 = TObjPtr<AActor>::operator!=
                                           ((TObjPtr<AActor> *)
                                            ((thing->super_DThinker).super_DObject._vptr_DObject +
                                            0x41),(AActor *)0x0);
                        dVar22 = topz;
                        if (bVar21) {
                          pAVar18 = TObjPtr::operator_cast_to_AActor_
                                              ((TObjPtr *)
                                               ((thing->super_DThinker).super_DObject._vptr_DObject
                                               + 0x41));
                          dVar23 = topz;
                          if ((AActor *)dVar22 == pAVar18) {
                            it_local._7_1_ = 1;
                            bVar8 = it_local._7_1_;
                            goto LAB_0057f870;
                          }
                          pAVar18 = TObjPtr::operator_cast_to_AActor_
                                              ((TObjPtr *)
                                               ((thing->super_DThinker).super_DObject._vptr_DObject
                                               + 0x41));
                          bVar21 = CanAttackHurt((AActor *)dVar23,pAVar18);
                          if (!bVar21) {
                            it_local._7_1_ = 0;
                            bVar8 = it_local._7_1_;
                            goto LAB_0057f870;
                          }
                        }
                        TFlags<ActorFlag,_unsigned_int>::operator&
                                  (&local_278,
                                   SUB84(topz,0) +
                                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|
                                    MF_NOSECTOR|MF_SHOOTABLE));
                        uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_278);
                        if (uVar11 == 0) {
                          TFlags<ActorFlag,_unsigned_int>::operator&
                                    (&local_27c,
                                     SUB84(topz,0) +
                                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|
                                      MF_NOSECTOR|MF_SHOOTABLE));
                          uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_27c);
                          bVar8 = uVar11 == 0;
                        }
                        else {
                          TFlags<ActorFlag4,_unsigned_int>::operator&
                                    (&local_280,
                                     SUB84(topz,0) +
                                     (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|
                                     MF4_BOSSDEATH));
                          uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_280);
                          bVar21 = false;
                          if (uVar11 != 0) {
                            TFlags<ActorFlag4,_unsigned_int>::operator&
                                      (&local_284,
                                       (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                                       (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|
                                       MF4_BOSSDEATH));
                            uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_284);
                            bVar21 = uVar11 == 0;
                          }
                          if (bVar21) {
                            it_local._7_1_ = 1;
                            bVar8 = it_local._7_1_;
                          }
                          else {
                            local_57a = false;
                            if (((ulong)(thing->VisibleStartPitch).Degrees & 1) != 0) {
                              TFlags<ActorFlag5,_unsigned_int>::operator&
                                        (&local_288,
                                         SUB84(topz,0) +
                                         (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|
                                          MF5_NOFORWARDFALL|MF5_NODROPOFF));
                              uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_288);
                              local_57a = false;
                              if (uVar11 == 0) {
                                local_57a = CheckRipLevel((AActor *)topz,
                                                          (AActor *)
                                                          (thing->super_DThinker).super_DObject.
                                                          _vptr_DObject);
                              }
                            }
                            if (local_57a != false) {
                              TFlags<ActorFlag6,_unsigned_int>::operator&
                                        ((TFlags<ActorFlag6,_unsigned_int> *)((long)&check + 4),
                                         (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                                         (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|
                                         MF6_NOFEAR));
                              uVar11 = TFlags::operator_cast_to_unsigned_int
                                                 ((TFlags *)((long)&check + 4));
                              bVar21 = true;
                              if (uVar11 != 0) {
                                TFlags<ActorFlag2,_unsigned_int>::operator&
                                          ((TFlags<ActorFlag2,_unsigned_int> *)&check,
                                           SUB84(topz,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
                                uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&check);
                                bVar21 = uVar11 == 0;
                              }
                              if (bVar21) {
                                local_298.Degrees =
                                     (double)TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>
                                             ::CheckKey((
                                                  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>
                                                  *)&thing->SpriteAngle,topz);
                                if (((bool *)local_298.Degrees == (bool *)0x0) ||
                                   ((*(bool *)local_298.Degrees & 1U) == 0)) {
                                  pbVar19 = TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>
                                            ::operator[]((
                                                  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>
                                                  *)&thing->SpriteAngle,(AActor *)topz);
                                  *pbVar19 = true;
                                  TFlags<ActorFlag,_unsigned_int>::operator&
                                            (&local_29c,
                                             SUB84(topz,0) +
                                             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|
                                              MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
                                  uVar11 = TFlags::operator_cast_to_unsigned_int
                                                     ((TFlags *)&local_29c);
                                  bVar21 = false;
                                  if (uVar11 == 0) {
                                    TFlags<ActorFlag2,_unsigned_int>::operator&
                                              (&local_2a0,
                                               SUB84(topz,0) +
                                               (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
                                    uVar11 = TFlags::operator_cast_to_unsigned_int
                                                       ((TFlags *)&local_2a0);
                                    bVar21 = false;
                                    if (uVar11 == 0) {
                                      TFlags<ActorFlag3,_unsigned_int>::operator&
                                                (&local_2a4,
                                                 (int)(thing->super_DThinker).super_DObject.
                                                      _vptr_DObject +
                                                 (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|
                                                 MF3_NORADIUSDMG));
                                      uVar11 = TFlags::operator_cast_to_unsigned_int
                                                         ((TFlags *)&local_2a4);
                                      bVar21 = false;
                                      if (uVar11 == 0) {
                                        pSVar13 = (Self *)((long)topz + 0x1c0);
                                        operator|((EnumType)local_2ac,MF2_INVULNERABLE);
                                        TFlags<ActorFlag2,_unsigned_int>::operator&
                                                  (&local_2a8,pSVar13);
                                        uVar11 = TFlags::operator_cast_to_unsigned_int
                                                           ((TFlags *)&local_2a8);
                                        bVar21 = uVar11 == 0;
                                      }
                                    }
                                  }
                                  if (bVar21) {
                                    P_RipperBlood((AActor *)
                                                  (thing->super_DThinker).super_DObject.
                                                  _vptr_DObject,(AActor *)topz);
                                  }
                                  pAVar18 = (AActor *)
                                            (thing->super_DThinker).super_DObject._vptr_DObject;
                                  FSoundID::FSoundID((FSoundID *)&newdam_1,"misc/ripslop");
                                  S_Sound(pAVar18,4,(FSoundID *)&newdam_1,1.0,1.001);
                                  dVar22 = topz;
                                  if ((0 < *(int *)((thing->super_DThinker).super_DObject.
                                                    _vptr_DObject + 0x6c)) &&
                                     (*(int *)((thing->super_DThinker).super_DObject._vptr_DObject +
                                              0x6d) != -0x80000000)) {
                                    pAVar18 = (AActor *)
                                              (thing->super_DThinker).super_DObject._vptr_DObject;
                                    pAVar20 = TObjPtr::operator_cast_to_AActor_
                                                        ((TObjPtr *)
                                                         ((thing->super_DThinker).super_DObject.
                                                          _vptr_DObject + 0x41));
                                    iVar12 = *(int *)((thing->super_DThinker).super_DObject.
                                                      _vptr_DObject + 0x6c);
                                    iVar3 = *(int *)((thing->super_DThinker).super_DObject.
                                                     _vptr_DObject + 0x6d);
                                    iVar4 = *(int *)((long)(thing->super_DThinker).super_DObject.
                                                           _vptr_DObject + 0x36c);
                                    FName::FName(&local_2b4,
                                                 (FName *)((long)(thing->super_DThinker).
                                                                 super_DObject._vptr_DObject + 0x364
                                                          ));
                                    P_PoisonMobj((AActor *)dVar22,pAVar18,pAVar20,iVar12,iVar3,iVar4
                                                 ,&local_2b4);
                                  }
                                  local_48._0_4_ =
                                       AActor::GetMissileDamage
                                                 ((AActor *)
                                                  (thing->super_DThinker).super_DObject.
                                                  _vptr_DObject,3,2);
                                  dVar22 = topz;
                                  pAVar18 = (AActor *)
                                            (thing->super_DThinker).super_DObject._vptr_DObject;
                                  pAVar20 = TObjPtr::operator_cast_to_AActor_
                                                      ((TObjPtr *)
                                                       ((thing->super_DThinker).super_DObject.
                                                        _vptr_DObject + 0x41));
                                  uVar6 = local_48._0_4_;
                                  FName::FName(&local_2bc,
                                               (FName *)((long)(thing->super_DThinker).super_DObject
                                                               ._vptr_DObject + 0x404));
                                  TAngle<double>::TAngle(&local_2c8,0.0);
                                  local_2b8 = P_DamageMobj((AActor *)dVar22,pAVar18,pAVar20,uVar6,
                                                           &local_2bc,0,&local_2c8);
                                  TFlags<ActorFlag3,_unsigned_int>::operator&
                                            (&local_2cc,
                                             (int)(thing->super_DThinker).super_DObject.
                                                  _vptr_DObject +
                                             (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|
                                             MF3_NORADIUSDMG));
                                  uVar11 = TFlags::operator_cast_to_unsigned_int
                                                     ((TFlags *)&local_2cc);
                                  if (uVar11 == 0) {
                                    if (local_2b8 < 1) {
                                      local_5dc = local_48._0_4_;
                                    }
                                    else {
                                      local_5dc = local_2b8;
                                    }
                                    P_TraceBleed(local_5dc,(AActor *)topz,
                                                 (AActor *)
                                                 (thing->super_DThinker).super_DObject._vptr_DObject
                                                );
                                  }
                                  TFlags<ActorFlag2,_unsigned_int>::operator&
                                            (&local_2d0,
                                             SUB84(topz,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT)
                                            );
                                  uVar11 = TFlags::operator_cast_to_unsigned_int
                                                     ((TFlags *)&local_2d0);
                                  bVar21 = false;
                                  if (uVar11 != 0) {
                                    TFlags<ActorFlag2,_unsigned_int>::operator&
                                              (&local_2d4,
                                               (int)(thing->super_DThinker).super_DObject.
                                                    _vptr_DObject +
                                               (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
                                    uVar11 = TFlags::operator_cast_to_unsigned_int
                                                       ((TFlags *)&local_2d4);
                                    bVar21 = uVar11 == 0;
                                  }
                                  if ((bVar21) &&
                                     (*(int *)((long)topz + 0x330) !=
                                      *(int *)((long)&(thing->VisibleStartPitch).Degrees + 4))) {
                                    TVector3<double>::XY((TVector3<double> *)local_2f8);
                                    operator*((TVector2<double> *)(local_2f8 + 0x10),
                                              *(double *)((long)topz + 0x328));
                                    TVector3<double>::operator+=
                                              ((TVector3<double> *)((long)topz + 200),
                                               (Vector2 *)(local_2f8 + 0x10));
                                    *(undefined4 *)((long)topz + 0x330) =
                                         *(undefined4 *)
                                          ((long)&(thing->VisibleStartPitch).Degrees + 4);
                                  }
                                }
                                TArray<spechit_t,_spechit_t>::Clear(&spechit);
                                it_local._7_1_ = 1;
                                bVar8 = it_local._7_1_;
                                goto LAB_0057f870;
                              }
                            }
                            dVar22 = topz;
                            if ((0 < *(int *)((thing->super_DThinker).super_DObject._vptr_DObject +
                                             0x6c)) &&
                               (*(int *)((thing->super_DThinker).super_DObject._vptr_DObject + 0x6d)
                                != -0x80000000)) {
                              pAVar18 = (AActor *)
                                        (thing->super_DThinker).super_DObject._vptr_DObject;
                              pAVar20 = TObjPtr::operator_cast_to_AActor_
                                                  ((TObjPtr *)
                                                   ((thing->super_DThinker).super_DObject.
                                                    _vptr_DObject + 0x41));
                              iVar12 = *(int *)((thing->super_DThinker).super_DObject._vptr_DObject
                                               + 0x6c);
                              iVar3 = *(int *)((thing->super_DThinker).super_DObject._vptr_DObject +
                                              0x6d);
                              iVar4 = *(int *)((long)(thing->super_DThinker).super_DObject.
                                                     _vptr_DObject + 0x36c);
                              FName::FName(&local_2fc,
                                           (FName *)((long)(thing->super_DThinker).super_DObject.
                                                           _vptr_DObject + 0x364));
                              P_PoisonMobj((AActor *)dVar22,pAVar18,pAVar20,iVar12,iVar3,iVar4,
                                           &local_2fc);
                            }
                            pAVar18 = (AActor *)(thing->super_DThinker).super_DObject._vptr_DObject;
                            TFlags<ActorFlag4,_unsigned_int>::operator&
                                      (&local_300,
                                       (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                                       (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|
                                       MF4_BOSSDEATH));
                            uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_300);
                            iVar12 = 7;
                            if (uVar11 != 0) {
                              iVar12 = 3;
                            }
                            local_48._0_4_ = AActor::GetMissileDamage(pAVar18,iVar12,1);
                            bVar21 = true;
                            if ((int)local_48._0_4_ < 1) {
                              TFlags<ActorFlag6,_unsigned_int>::operator&
                                        ((TFlags<ActorFlag6,_unsigned_int> *)&newdam_2,
                                         (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                                         (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|
                                         MF6_NOFEAR));
                              uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&newdam_2);
                              bVar21 = true;
                              if (uVar11 == 0) {
                                TFlags<ActorFlag7,_unsigned_int>::operator&
                                          (&local_308,
                                           (int)(thing->super_DThinker).super_DObject._vptr_DObject
                                           + (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_BUDDHA|
                                              MF7_WEAPONSPAWN|MF7_ALWAYSTELEFRAG));
                                uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_308)
                                ;
                                bVar21 = uVar11 != 0;
                              }
                            }
                            dVar22 = topz;
                            if (bVar21) {
                              pAVar18 = (AActor *)
                                        (thing->super_DThinker).super_DObject._vptr_DObject;
                              pAVar20 = TObjPtr::operator_cast_to_AActor_
                                                  ((TObjPtr *)
                                                   ((thing->super_DThinker).super_DObject.
                                                    _vptr_DObject + 0x41));
                              uVar6 = local_48._0_4_;
                              FName::FName(&local_310,
                                           (FName *)((long)(thing->super_DThinker).super_DObject.
                                                           _vptr_DObject + 0x404));
                              TAngle<double>::TAngle(&local_318,0.0);
                              local_30c = P_DamageMobj((AActor *)dVar22,pAVar18,pAVar20,uVar6,
                                                       &local_310,0,&local_318);
                              if (0 < (int)local_48._0_4_) {
                                TFlags<ActorFlag5,_unsigned_int>::operator&
                                          (&local_31c,
                                           (int)(thing->super_DThinker).super_DObject._vptr_DObject
                                           + (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_NODAMAGE|
                                              MF5_NOFORWARDFALL|MF5_NODROPOFF));
                                uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_31c)
                                ;
                                bVar21 = false;
                                if (uVar11 != 0) {
                                  TFlags<ActorFlag,_unsigned_int>::operator&
                                            (&local_320,
                                             SUB84(topz,0) +
                                             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|
                                              MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
                                  uVar11 = TFlags::operator_cast_to_unsigned_int
                                                     ((TFlags *)&local_320);
                                  bVar21 = false;
                                  if (uVar11 == 0) {
                                    TFlags<ActorFlag2,_unsigned_int>::operator&
                                              (&local_324,
                                               SUB84(topz,0) +
                                               (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
                                    uVar11 = TFlags::operator_cast_to_unsigned_int
                                                       ((TFlags *)&local_324);
                                    bVar21 = false;
                                    if (uVar11 == 0) {
                                      pSVar13 = (Self *)((long)topz + 0x1c0);
                                      operator|((EnumType)local_32c,MF2_INVULNERABLE);
                                      TFlags<ActorFlag2,_unsigned_int>::operator&
                                                (&local_328,pSVar13);
                                      uVar11 = TFlags::operator_cast_to_unsigned_int
                                                         ((TFlags *)&local_328);
                                      bVar21 = false;
                                      if (uVar11 == 0) {
                                        TFlags<ActorFlag3,_unsigned_int>::operator&
                                                  (&local_330,
                                                   (int)(thing->super_DThinker).super_DObject.
                                                        _vptr_DObject +
                                                   (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|
                                                   MF3_NORADIUSDMG));
                                        uVar11 = TFlags::operator_cast_to_unsigned_int
                                                           ((TFlags *)&local_330);
                                        bVar21 = false;
                                        if (uVar11 == 0) {
                                          iVar12 = FRandom::operator()(&pr_checkthing);
                                          bVar21 = iVar12 < 0xc0;
                                        }
                                      }
                                    }
                                  }
                                }
                                if (bVar21) {
                                  AActor::Pos((DVector3 *)(local_350 + 8),
                                              (AActor *)
                                              (thing->super_DThinker).super_DObject._vptr_DObject);
                                  dVar22 = topz;
                                  AActor::AngleTo((AActor *)local_350,
                                                  (AActor *)
                                                  (thing->super_DThinker).super_DObject.
                                                  _vptr_DObject,SUB81(topz,0));
                                  P_BloodSplatter((DVector3 *)(local_350 + 8),(AActor *)dVar22,
                                                  (DAngle *)local_350);
                                }
                                TFlags<ActorFlag3,_unsigned_int>::operator&
                                          (&local_354,
                                           (int)(thing->super_DThinker).super_DObject._vptr_DObject
                                           + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|
                                             MF3_NORADIUSDMG));
                                uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_354)
                                ;
                                if (uVar11 == 0) {
                                  if (local_30c < 1) {
                                    local_654 = local_48._0_4_;
                                  }
                                  else {
                                    local_654 = local_30c;
                                  }
                                  P_TraceBleed(local_654,(AActor *)topz,
                                               (AActor *)
                                               (thing->super_DThinker).super_DObject._vptr_DObject);
                                }
                              }
                            }
                            else {
                              P_GiveBody((AActor *)topz,-local_48._0_4_,0);
                            }
                            TFlags<ActorFlag7,_unsigned_int>::operator&
                                      (&local_358,
                                       SUB84(topz,0) +
                                       (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_BUDDHA|MF7_WEAPONSPAWN|
                                       MF7_ALWAYSTELEFRAG));
                            uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_358);
                            bVar21 = false;
                            if (uVar11 != 0) {
                              TFlags<ActorFlag2,_unsigned_int>::operator&
                                        (&local_35c,
                                         SUB84(topz,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
                              uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_35c);
                              bVar21 = false;
                              if (uVar11 != 0) {
                                TFlags<ActorFlag,_unsigned_int>::operator&
                                          (&local_360,
                                           (int)(thing->super_DThinker).super_DObject._vptr_DObject
                                           + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|
                                              MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
                                uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_360)
                                ;
                                bVar21 = uVar11 != 0;
                              }
                            }
                            if (bVar21) {
                              TFlags<ActorFlag2,_unsigned_int>::operator&
                                        (&local_364,
                                         (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                                         (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
                              uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_364);
                              if (uVar11 != 0) {
                                (thing->super_DThinker).super_DObject._vptr_DObject[0x4f] =
                                     (thing->super_DThinker).super_DObject._vptr_DObject[0x41];
                              }
                              TObjPtr<AActor>::operator=
                                        ((TObjPtr<AActor> *)
                                         ((thing->super_DThinker).super_DObject._vptr_DObject + 0x41
                                         ),(AActor *)topz);
                              it_local._7_1_ = 1;
                              bVar8 = it_local._7_1_;
                            }
                            else {
                              it_local._7_1_ = 0;
                              bVar8 = it_local._7_1_;
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    it_local._7_1_ = 1;
                    bVar8 = it_local._7_1_;
                  }
                }
                else {
                  it_local._7_1_ = 1;
                  bVar8 = it_local._7_1_;
                }
              }
            }
            else {
              it_local._7_1_ = 1;
              bVar8 = it_local._7_1_;
            }
          }
        }
        else {
          it_local._7_1_ = 1;
          bVar8 = it_local._7_1_;
        }
      }
      else {
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  (&local_368,SUB84(topz,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
        uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_368);
        bVar21 = false;
        if (uVar11 != 0) {
          TFlags<ActorFlag2,_unsigned_int>::operator&
                    (&local_36c,
                     (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                     (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
          uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_36c);
          bVar21 = uVar11 == 0;
        }
        if ((bVar21) &&
           (*(int *)((long)topz + 0x330) != *(int *)((long)&(thing->VisibleStartPitch).Degrees + 4))
           ) {
          TVector3<double>::XY((TVector3<double> *)local_390);
          operator*((TVector2<double> *)(local_390 + 0x10),*(double *)((long)topz + 0x328));
          TVector3<double>::operator+=
                    ((TVector3<double> *)((long)topz + 200),(Vector2 *)(local_390 + 0x10));
          *(undefined4 *)((long)topz + 0x330) =
               *(undefined4 *)((long)&(thing->VisibleStartPitch).Degrees + 4);
        }
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_394,
                   SUB84(topz,0) +
                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE
                   ));
        uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_394);
        local_657 = false;
        if (uVar11 != 0) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_398,
                     SUB84(topz,0) +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
          uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_398);
          local_657 = false;
          if (uVar11 == 0) {
            TFlags<ActorFlag,_unsigned_int>::operator&
                      (&local_39c,
                       (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                       (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                       MF_SHOOTABLE));
            uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_39c);
            local_658 = true;
            if (uVar11 == 0) {
              TFlags<ActorFlag6,_unsigned_int>::operator&
                        (&local_3a0,
                         (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                         (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
              uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_3a0);
              local_658 = uVar11 != 0;
            }
            local_657 = local_658;
          }
        }
        local_48._7_1_ = local_657;
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_3a4,
                   SUB84(topz,0) +
                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE
                   ));
        uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_3a4);
        bVar21 = false;
        if (uVar11 != 0) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_3a8,
                     (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
          uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_3a8);
          bVar21 = false;
          if (uVar11 != 0) {
            dVar22 = AActor::Z((AActor *)topz);
            dVar23 = AActor::Top((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
            bVar21 = dVar22 < dVar23 - (double)(thing->super_DThinker).super_DObject._vptr_DObject
                                               [0x7e];
          }
        }
        if (bVar21) {
          P_TouchSpecialThing((AActor *)topz,
                              (AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
        }
        local_669 = 1;
        if ((local_48._7_1_ & 1) != 0) {
          local_669 = local_79;
        }
        bVar8 = local_669 & 1;
      }
    }
    else {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (local_1e0,
                 SUB84(topz,0) +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)local_1e0);
      bVar21 = false;
      if (uVar11 != 0) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_1e4,
                   SUB84(topz,0) +
                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE
                   ));
        uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1e4);
        bVar21 = false;
        if (uVar11 == 0) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_1e8,
                     (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
          uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1e8);
          bVar21 = true;
          if (uVar11 == 0) {
            TFlags<ActorFlag6,_unsigned_int>::operator&
                      (&local_1ec,
                       (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                       (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_DONTHARMSPECIES|MF6_NOFEAR));
            uVar11 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1ec);
            bVar21 = uVar11 != 0;
          }
        }
      }
      local_4fc = 1;
      if (bVar21) {
        local_4fc = local_79;
      }
      bVar8 = local_4fc & 1;
    }
  }
  else {
    bVar8 = AActor::CallSlam((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject,
                             (AActor *)(thing->super_DThinker).super_DObject._vptr_DObject[0x6a]);
    (thing->super_DThinker).super_DObject._vptr_DObject[0x6a] = (_func_int *)0x0;
  }
LAB_0057f870:
  it_local._7_1_ = bVar8;
  return (bool)(it_local._7_1_ & 1);
}

Assistant:

bool PIT_CheckThing(FMultiBlockThingsIterator &it, FMultiBlockThingsIterator::CheckResult &cres, const FBoundingBox &box, FCheckPosition &tm)
{
	AActor *thing = cres.thing;
	double topz;
	bool 	solid;
	int 	damage;

	// don't clip against self
	if (thing == tm.thing)
		return true;

	if (!((thing->flags & (MF_SOLID | MF_SPECIAL | MF_SHOOTABLE)) || thing->flags6 & MF6_TOUCHY))
		return true;	// can't hit thing

	double blockdist = thing->radius + tm.thing->radius;
	if (fabs(thing->X() - cres.Position.X) >= blockdist || fabs(thing->Y() - cres.Position.Y) >= blockdist)
		return true;

	if ((thing->flags2 | tm.thing->flags2) & MF2_THRUACTORS)
		return true;

	if ((tm.thing->flags6 & MF6_THRUSPECIES) && (tm.thing->GetSpecies() == thing->GetSpecies()))
		return true;

	tm.thing->BlockingMobj = thing;
	topz = thing->Top();

	// Both things overlap in x or y direction
	bool unblocking = false;

	// walking on other actors and unblocking is too messy through restricted portal types so disable it.
	if (!(cres.portalflags & FFCF_RESTRICTEDPORTAL))
	{
		if (!(i_compatflags & COMPATF_NO_PASSMOBJ) && !(tm.thing->flags & (MF_FLOAT | MF_MISSILE | MF_SKULLFLY | MF_NOGRAVITY)) &&
			(thing->flags & MF_SOLID) && (thing->flags4 & MF4_ACTLIKEBRIDGE))
		{
			// [RH] Let monsters walk on actors as well as floors
			if ((tm.thing->flags3 & MF3_ISMONSTER) &&
				topz >= tm.floorz && topz <= tm.thing->Z() + tm.thing->MaxStepHeight)
			{
				// The commented-out if is an attempt to prevent monsters from walking off a
				// thing further than they would walk off a ledge. I can't think of an easy
				// way to do this, so I restrict them to only walking on bridges instead.
				// Uncommenting the if here makes it almost impossible for them to walk on
				// anything, bridge or otherwise.
				//			if (abs(thing->x - tmx) <= thing->radius &&
				//				abs(thing->y - tmy) <= thing->radius)
				{
					tm.stepthing = thing;
					tm.floorz = topz;
				}
			}
		}

		if (((tm.FromPMove || tm.thing->player != NULL) && thing->flags&MF_SOLID))
		{
			DVector3 oldpos = tm.thing->PosRelative(thing);
			// Both actors already overlap. To prevent them from remaining stuck allow the move if it
			// takes them further apart or the move does not change the position (when called from P_ChangeSector.)
			if (tm.pos.X == tm.thing->X() && tm.pos.Y == tm.thing->Y())
			{
				unblocking = true;
			}
			else if (fabs(thing->X() - oldpos.X) < (thing->radius + tm.thing->radius) &&
				fabs(thing->Y() - oldpos.Y) < (thing->radius + tm.thing->radius))

			{
				double newdist = thing->Distance2D(cres.Position.X, cres.Position.Y);
				double olddist = thing->Distance2D(oldpos.X, oldpos.Y);

				if (newdist > olddist)
				{
					// unblock only if there's already a vertical overlap (or both actors are flagged not to overlap)
					unblocking = (tm.thing->Top() > thing->Z() && tm.thing->Z() < topz) || (tm.thing->flags3 & thing->flags3 & MF3_DONTOVERLAP);
				}
			}
		}
	}

	// [RH] If the other thing is a bridge, then treat the moving thing as if it had MF2_PASSMOBJ, so
	// you can use a scrolling floor to move scenery items underneath a bridge.
	if ((tm.thing->flags2 & MF2_PASSMOBJ || thing->flags4 & MF4_ACTLIKEBRIDGE) && !(i_compatflags & COMPATF_NO_PASSMOBJ))
	{ // check if a mobj passed over/under another object
		if (!(tm.thing->flags & MF_MISSILE) ||
			!(tm.thing->flags2 & MF2_RIP) ||
			(thing->flags5 & MF5_DONTRIP) ||
			((tm.thing->flags6 & MF6_NOBOSSRIP) && (thing->flags2 & MF2_BOSS)))
		{
			// Some things prefer not to overlap each other, if possible (Q: Is this even needed anymore? It was just for dealing with some deficiencies in the code below in Heretic.)
			if (!(tm.thing->flags3 & thing->flags3 & MF3_DONTOVERLAP))
			{
				if ((tm.thing->Z() >= topz) || (tm.thing->Top() <= thing->Z()))
					return true;
			}
			// If they are not allowed to overlap, the rest of this function still needs to be executed.
		}
	}

	// Call the script callback. This must be done before any other checks that perform some actual action or may already return a 'block'.
	// The checks here are to do this only for conditions that would later result in an action, calling this for everything would be too much of a drag if
	// too many scripted overrides were being used, as PIT_CheckThing is even called for touching all the monster corpses lying around.
	if (((thing->flags & MF_SOLID) || (thing->flags6 & (MF6_TOUCHY | MF6_BUMPSPECIAL))) && 
		((tm.thing->flags & (MF_SOLID|MF_MISSILE)) || (tm.thing->flags2 & MF2_BLASTED) || (tm.thing->flags6 & MF6_BLOCKEDBYSOLIDACTORS) || (tm.thing->BounceFlags & BOUNCE_MBF)))
	{
		static unsigned VIndex = ~0u;
		if (VIndex == ~0u)
		{
			VIndex = GetVirtualIndex(RUNTIME_CLASS(AActor), "CanCollideWith");
			assert(VIndex != ~0u);
		}

		VMValue params[3] = { tm.thing, thing, false };
		VMReturn ret;
		int retval;
		ret.IntAt(&retval);

		auto clss = tm.thing->GetClass();
		VMFunction *func = clss->Virtuals.Size() > VIndex ? clss->Virtuals[VIndex] : nullptr;
		if (func != nullptr)
		{
			GlobalVMStack.Call(func, params, 3, &ret, 1, nullptr);
			if (!retval) return true;
		}
		std::swap(params[0].a, params[1].a);
		params[2].i = true;

		// re-get for the other actor.
		clss = thing->GetClass();
		func = clss->Virtuals.Size() > VIndex ? clss->Virtuals[VIndex] : nullptr;
		if (func != nullptr)
		{
			GlobalVMStack.Call(func, params, 3, &ret, 1, nullptr);
			if (!retval) return true;
		}
	}


	if (tm.thing->player == NULL || !(tm.thing->player->cheats & CF_PREDICTING))
	{
		// touchy object is alive, toucher is solid
		if (thing->flags6 & MF6_TOUCHY && tm.thing->flags & MF_SOLID && thing->health > 0 &&
			// Thing is an armed mine or a sentient thing
			(thing->flags6 & MF6_ARMED || thing->IsSentient()) &&
			// either different classes or players
			(thing->player || thing->GetClass() != tm.thing->GetClass()) &&
			// or different species if DONTHARMSPECIES
			(!(thing->flags6 & MF6_DONTHARMSPECIES) || thing->GetSpecies() != tm.thing->GetSpecies()) &&
			// touches vertically
			topz >= tm.thing->Z() && tm.thing->Top() >= thing->Z() &&
			// prevents lost souls from exploding when fired by pain elementals
			(thing->master != tm.thing && tm.thing->master != thing))
			// Difference with MBF: MBF hardcodes the LS/PE check and lets actors of the same species
			// but different classes trigger the touchiness, but that seems less straightforwards.
		{
			thing->flags6 &= ~MF6_ARMED; // Disarm
			P_DamageMobj(thing, NULL, NULL, thing->health, NAME_None, DMG_FORCED);  // kill object
			return true;
		}

		// Check for MF6_BUMPSPECIAL
		// By default, only players can activate things by bumping into them
		if ((thing->flags6 & MF6_BUMPSPECIAL) && ((tm.thing->player != NULL)
			|| ((thing->activationtype & THINGSPEC_MonsterTrigger) && (tm.thing->flags3 & MF3_ISMONSTER))
			|| ((thing->activationtype & THINGSPEC_MissileTrigger) && (tm.thing->flags & MF_MISSILE))
			) && (level.maptime > thing->lastbump)) // Leave the bumper enough time to go away
		{
			if (P_ActivateThingSpecial(thing, tm.thing))
				thing->lastbump = level.maptime + TICRATE;
		}
	}

	// Check for skulls slamming into things
	if (tm.thing->flags & MF_SKULLFLY)
	{
		bool res = tm.thing->CallSlam(tm.thing->BlockingMobj);
		tm.thing->BlockingMobj = NULL;
		return res;
	}

	// [ED850] Player Prediction ends here. There is nothing else they could/should do.
	if (tm.thing->player != NULL && (tm.thing->player->cheats & CF_PREDICTING))
	{
		solid = (thing->flags & MF_SOLID) &&
			!(thing->flags & MF_NOCLIP) &&
			((tm.thing->flags & MF_SOLID) || (tm.thing->flags6 & MF6_BLOCKEDBYSOLIDACTORS));

		return !solid || unblocking;
	}

	// Check for blasted thing running into another
	if ((tm.thing->flags2 & MF2_BLASTED) && (thing->flags & MF_SHOOTABLE))
	{
		if (!(thing->flags2 & MF2_BOSS) && (thing->flags3 & MF3_ISMONSTER) && !(thing->flags3 & MF3_DONTBLAST))
		{
			// ideally this should take the mass factor into account
			thing->Vel += tm.thing->Vel.XY();
			if (fabs(thing->Vel.X) + fabs(thing->Vel.Y) > 3.)
			{
				int newdam;
				damage = (tm.thing->Mass / 100) + 1;
				newdam = P_DamageMobj(thing, tm.thing, tm.thing, damage, tm.thing->DamageType);
				P_TraceBleed(newdam > 0 ? newdam : damage, thing, tm.thing);
				damage = (thing->Mass / 100) + 1;
				newdam = P_DamageMobj(tm.thing, thing, thing, damage >> 2, tm.thing->DamageType);
				P_TraceBleed(newdam > 0 ? newdam : damage, tm.thing, thing);
			}
			return false;
		}
	}
	// Check for missile or non-solid MBF bouncer
	if (tm.thing->flags & MF_MISSILE || ((tm.thing->BounceFlags & BOUNCE_MBF) && !(tm.thing->flags & MF_SOLID)))
	{
		// Check for a non-shootable mobj
		if (thing->flags2 & MF2_NONSHOOTABLE)
		{
			return true;
		}
		// Check for passing through a ghost
		if ((thing->flags3 & MF3_GHOST) && (tm.thing->flags2 & MF2_THRUGHOST))
		{
			return true;
		}

		if ((tm.thing->flags6 & MF6_MTHRUSPECIES)
			&& tm.thing->target // NULL pointer check
			&& (tm.thing->target->GetSpecies() == thing->GetSpecies()))
			return true;

		// Check for rippers passing through corpses
		if ((thing->flags & MF_CORPSE) && (tm.thing->flags2 & MF2_RIP) && !(thing->flags & MF_SHOOTABLE))
		{
			return true;
		}

		double clipheight;

		if (thing->projectilepassheight > 0)
		{
			clipheight = thing->projectilepassheight;
		}
		else if (thing->projectilepassheight < 0 && (i_compatflags & COMPATF_MISSILECLIP))
		{
			clipheight = -thing->projectilepassheight;
		}
		else
		{
			clipheight = thing->Height;
		}

		// Check if it went over / under
		if (tm.thing->Z() > thing->Z() + clipheight)
		{ // Over thing
			return true;
		}
		if (tm.thing->Top() < thing->Z())
		{ // Under thing
			return true;
		}

		// [RH] What is the point of this check, again? In Hexen, it is unconditional,
		// but here we only do it if the missile's damage is 0.
		// MBF bouncer might have a non-0 damage value, but they must not deal damage on impact either.
		if ((tm.thing->BounceFlags & BOUNCE_Actors) && (tm.thing->IsZeroDamage() || !(tm.thing->flags & MF_MISSILE)))
		{
			return (tm.thing->target == thing || !(thing->flags & MF_SOLID));
		}

		switch (tm.thing->SpecialMissileHit(thing))
		{
		case 0:		return false;
		case 1:		return true;
		default:	break;
		}

		// [RH] Extend DeHacked infighting to allow for monsters
		// to never fight each other

		if (tm.thing->target != NULL)
		{
			if (thing == tm.thing->target)
			{ // Don't missile self
				return true;
			}

			if (!CanAttackHurt(thing, tm.thing->target))
			{
				return false;
			}
		}
		if (!(thing->flags & MF_SHOOTABLE))
		{ // Didn't do any damage
			return !(thing->flags & MF_SOLID);
		}
		if ((thing->flags4 & MF4_SPECTRAL) && !(tm.thing->flags4 & MF4_SPECTRAL))
		{
			return true;
		}

		if ((tm.DoRipping && !(thing->flags5 & MF5_DONTRIP)) && CheckRipLevel(thing, tm.thing))
		{
			if (!(tm.thing->flags6 & MF6_NOBOSSRIP) || !(thing->flags2 & MF2_BOSS))
			{
				bool *check = tm.LastRipped.CheckKey(thing);
				if (check == NULL || !*check)
				{
					tm.LastRipped[thing] = true;
					if (!(thing->flags & MF_NOBLOOD) &&
						!(thing->flags2 & MF2_REFLECTIVE) &&
						!(tm.thing->flags3 & MF3_BLOODLESSIMPACT) &&
						!(thing->flags2 & (MF2_INVULNERABLE | MF2_DORMANT)))
					{ // Ok to spawn blood
						P_RipperBlood(tm.thing, thing);
					}
					S_Sound(tm.thing, CHAN_BODY, "misc/ripslop", 1, ATTN_IDLE);

					// Do poisoning (if using new style poison)
					if (tm.thing->PoisonDamage > 0 && tm.thing->PoisonDuration != INT_MIN)
					{
						P_PoisonMobj(thing, tm.thing, tm.thing->target, tm.thing->PoisonDamage, tm.thing->PoisonDuration, tm.thing->PoisonPeriod, tm.thing->PoisonDamageType);
					}

					damage = tm.thing->GetMissileDamage(3, 2);
					int newdam = P_DamageMobj(thing, tm.thing, tm.thing->target, damage, tm.thing->DamageType);
					if (!(tm.thing->flags3 & MF3_BLOODLESSIMPACT))
					{
						P_TraceBleed(newdam > 0 ? newdam : damage, thing, tm.thing);
					}
					if (thing->flags2 & MF2_PUSHABLE
						&& !(tm.thing->flags2 & MF2_CANNOTPUSH))
					{ // Push thing
						if (thing->lastpush != tm.PushTime)
						{
							thing->Vel += tm.thing->Vel.XY() * thing->pushfactor;
							thing->lastpush = tm.PushTime;
						}
					}
				}
				spechit.Clear();
				return true;
			}
		}

		// Do poisoning (if using new style poison)
		if (tm.thing->PoisonDamage > 0 && tm.thing->PoisonDuration != INT_MIN)
		{
			P_PoisonMobj(thing, tm.thing, tm.thing->target, tm.thing->PoisonDamage, tm.thing->PoisonDuration, tm.thing->PoisonPeriod, tm.thing->PoisonDamageType);
		}

		// Do damage
		damage = tm.thing->GetMissileDamage((tm.thing->flags4 & MF4_STRIFEDAMAGE) ? 3 : 7, 1);
		if ((damage > 0) || (tm.thing->flags6 & MF6_FORCEPAIN) || (tm.thing->flags7 & MF7_CAUSEPAIN))
		{
			int newdam = P_DamageMobj(thing, tm.thing, tm.thing->target, damage, tm.thing->DamageType);
			if (damage > 0)
			{
				if ((tm.thing->flags5 & MF5_BLOODSPLATTER) &&
					!(thing->flags & MF_NOBLOOD) &&
					!(thing->flags2 & MF2_REFLECTIVE) &&
					!(thing->flags2 & (MF2_INVULNERABLE | MF2_DORMANT)) &&
					!(tm.thing->flags3 & MF3_BLOODLESSIMPACT) &&
					(pr_checkthing() < 192))
				{
					P_BloodSplatter(tm.thing->Pos(), thing, tm.thing->AngleTo(thing));
				}
				if (!(tm.thing->flags3 & MF3_BLOODLESSIMPACT))
				{
					P_TraceBleed(newdam > 0 ? newdam : damage, thing, tm.thing);
				}
			}
		}
		else
		{
			P_GiveBody(thing, -damage);
		}

		if ((thing->flags7 & MF7_THRUREFLECT) && (thing->flags2 & MF2_REFLECTIVE) && (tm.thing->flags & MF_MISSILE))
		{
			if (tm.thing->flags2 & MF2_SEEKERMISSILE)
			{
				tm.thing->tracer = tm.thing->target;
			}
			tm.thing->target = thing;
			return true;
		}
		return false;		// don't traverse any more
	}
	if (thing->flags2 & MF2_PUSHABLE && !(tm.thing->flags2 & MF2_CANNOTPUSH))
	{ // Push thing
		if (thing->lastpush != tm.PushTime)
		{
			thing->Vel += tm.thing->Vel.XY() * thing->pushfactor;
			thing->lastpush = tm.PushTime;
		}
	}
	solid = (thing->flags & MF_SOLID) &&
		!(thing->flags & MF_NOCLIP) &&
		((tm.thing->flags & MF_SOLID) || (tm.thing->flags6 & MF6_BLOCKEDBYSOLIDACTORS));

	// Check for special pickup
	if ((thing->flags & MF_SPECIAL) && (tm.thing->flags & MF_PICKUP)
		// [RH] The next condition is to compensate for the extra height
		// that gets added by P_CheckPosition() so that you cannot pick
		// up things that are above your true height.
		&& thing->Z() < tm.thing->Top() - tm.thing->MaxStepHeight)
	{ // Can be picked up by tmthing
		P_TouchSpecialThing(thing, tm.thing);	// can remove thing
	}

	// killough 3/16/98: Allow non-solid moving objects to move through solid
	// ones, by allowing the moving thing (tmthing) to move if it's non-solid,
	// despite another solid thing being in the way.
	// killough 4/11/98: Treat no-clipping things as not blocking

	return !solid || unblocking;

	// return !(thing->flags & MF_SOLID);	// old code -- killough
}